

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_kernel clCreateKernel(cl_program program,char *kernel_name,cl_int *errcode_ret)

{
  CTracker *pCVar1;
  bool bVar2;
  ulong enqueueCounter;
  CLIntercept *this;
  cl_kernel kernel;
  time_point end;
  cl_kernel retVal;
  cl_int localErrorCode;
  allocator local_69;
  cl_kernel local_68;
  string local_60;
  time_point local_40;
  cl_int local_34;
  
  this = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     ((g_pIntercept->m_Dispatch).clCreateKernel == (cl_api_clCreateKernel)0x0)) {
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x2c;
    }
    return (cl_kernel)0x0;
  }
  enqueueCounter = (g_pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if ((g_pIntercept->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (g_pIntercept,"clCreateKernel",enqueueCounter,(cl_kernel)0x0,
               "program = %p, kernel_name = %s",program,kernel_name);
  }
  local_34 = 0;
  if ((((this->m_Config).CallLogging == false) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret != (cl_int *)0x0) || ((this->m_Config).NoErrors == false)) goto LAB_00113530;
  }
  else if (errcode_ret != (cl_int *)0x0) goto LAB_00113530;
  errcode_ret = &local_34;
LAB_00113530:
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_40.__d.__r = (duration)0;
  }
  else {
    local_40.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  local_68 = (cl_kernel)0x0;
  if ((this->m_Config).OverrideBuiltinKernels == true) {
    std::__cxx11::string::string((string *)&local_60,kernel_name,&local_69);
    local_68 = CLIntercept::createBuiltinKernel(this,program,&local_60,errcode_ret);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  if (local_68 == (cl_kernel)0x0) {
    local_68 = (*(this->m_Dispatch).clCreateKernel)(program,kernel_name,errcode_ret);
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
      CLIntercept::updateHostTimingStats(this,"clCreateKernel",&local_60,local_40,end);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
  }
  bVar2 = (this->m_Config).ErrorLogging;
  if ((((bVar2 != false) || ((this->m_Config).ErrorAssert != false)) ||
      ((this->m_Config).NoErrors == true)) && (*errcode_ret != 0)) {
    if (bVar2 != false) {
      CLIntercept::logError(this,"clCreateKernel",*errcode_ret);
    }
    if ((this->m_Config).ErrorAssert == true) {
      raise(5);
    }
    if ((this->m_Config).NoErrors == true) {
      *errcode_ret = 0;
    }
  }
  if (((this->m_Config).LeakChecking == true) && (local_68 != (cl_kernel)0x0)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_Kernels;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clCreateKernel",*errcode_ret,(cl_event *)0x0,(cl_sync_point_khr *)0x0,
               "returned %p",local_68);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
    CLIntercept::chromeCallLoggingExit(this,"clCreateKernel",&local_60,false,0,local_40,end);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  kernel = local_68;
  if (local_68 != (cl_kernel)0x0) {
    std::__cxx11::string::string((string *)&local_60,kernel_name,&local_69);
    CLIntercept::addKernelInfo(this,kernel,program,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (((this->m_Config).KernelInfoLogging != false) ||
       ((this->m_Config).PreferredWorkGroupSizeMultipleLogging == true)) {
      CLIntercept::logKernelInfo(this,&local_68,1);
    }
  }
  return local_68;
}

Assistant:

CL_API_ENTRY cl_kernel CL_API_CALL CLIRN(clCreateKernel)(
    cl_program program,
    const char* kernel_name,
    cl_int* errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clCreateKernel )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "program = %p, kernel_name = %s",
            program,
            kernel_name );
        CHECK_ERROR_INIT( errcode_ret );
        HOST_PERFORMANCE_TIMING_START();

        cl_kernel   retVal = NULL;

        if( ( retVal == NULL ) &&
            pIntercept->config().OverrideBuiltinKernels )
        {
            retVal = pIntercept->createBuiltinKernel(
                program,
                kernel_name,
                errcode_ret );
        }

        if( retVal == NULL )
        {
            retVal = pIntercept->dispatch().clCreateKernel(
                program,
                kernel_name,
                errcode_ret );
        }

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( errcode_ret[0] );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

        if( retVal != NULL )
        {
            pIntercept->addKernelInfo(
                retVal,
                program,
                kernel_name );
            if( pIntercept->config().KernelInfoLogging ||
                pIntercept->config().PreferredWorkGroupSizeMultipleLogging )
            {
                pIntercept->logKernelInfo(
                    &retVal,
                    1 );
            }
        }

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_PROGRAM);
}